

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addConstructor(QMetaObjectBuilder *this,QByteArray *signature)

{
  QMetaObjectBuilderPrivate *pQVar1;
  pointer pQVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar4;
  QByteArray local_a8;
  QMetaMethodBuilderPrivate local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = (pQVar1->constructors).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (pQVar1->constructors).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char *)0x0;
  local_a8.d.size = 0;
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            (&local_90,Constructor,signature,&local_a8,Public,0);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
  emplace_back<QMetaMethodBuilderPrivate>(&pQVar1->constructors,&local_90);
  if (&(local_90.tag.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.tag.d.d)->super_QArrayData,1,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_90.parameterNames.d);
  if (&(local_90.returnType.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_90.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_90.returnType.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_90.signature.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_90.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_90.signature.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar4._index = ~((int)((ulong)((long)pQVar3 - (long)pQVar2) >> 3) * -0x3b13b13b);
    QVar4._mobj = this;
    QVar4._12_4_ = 0;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addConstructor(const QByteArray &signature)
{
    int index = int(d->constructors.size());
    d->constructors.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Constructor, signature,
                                                        /*returnType=*/QByteArray()));
    return QMetaMethodBuilder(this, -(index + 1));
}